

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_(TimeInMillis ms)

{
  bool bVar1;
  string *in_RDI;
  tm time_struct;
  tm *in_stack_fffffffffffffd38;
  int value;
  char *in_stack_fffffffffffffd40;
  allocator *paVar2;
  string *__lhs;
  string local_2a8 [16];
  int *in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [36];
  int local_1e4;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [8];
  int in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [55];
  allocator local_49 [21];
  int local_34;
  
  __lhs = in_RDI;
  bVar1 = PortableLocaltime((time_t)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  if (bVar1) {
    local_1e4 = local_34 + 0x76c;
    value = (int)((ulong)local_1e0 >> 0x20);
    StreamableToString<int>(in_stack_fffffffffffffd68);
    std::operator+(__lhs,in_stack_fffffffffffffd40);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::operator+(__lhs,in_stack_fffffffffffffd40);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::operator+(__lhs,in_stack_fffffffffffffd40);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::operator+(__lhs,in_stack_fffffffffffffd40);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::operator+(__lhs,in_stack_fffffffffffffd40);
    String::FormatIntWidth2_abi_cxx11_(value);
    std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::operator+(__lhs,in_stack_fffffffffffffd40);
    String::FormatIntWidthN_abi_cxx11_(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
    std::operator+(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_100);
    std::__cxx11::string::~string(local_120);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_1e0);
  }
  else {
    paVar2 = local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__lhs,"",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  return in_RDI;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss.sss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
         String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
         String::FormatIntWidth2(time_struct.tm_mday) + "T" +
         String::FormatIntWidth2(time_struct.tm_hour) + ":" +
         String::FormatIntWidth2(time_struct.tm_min) + ":" +
         String::FormatIntWidth2(time_struct.tm_sec) + "." +
         String::FormatIntWidthN(static_cast<int>(ms % 1000), 3);
}